

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::anon_unknown_0::StderrLogSink::~StderrLogSink(StderrLogSink *this)

{
  StderrLogSink *this_local;
  
  ~StderrLogSink(this);
  operator_delete(this,8);
  return;
}

Assistant:

void Send(const absl::LogEntry& entry) override {
    if (entry.log_severity() < absl::StderrThreshold() &&
        absl::log_internal::IsInitialized()) {
      return;
    }

    ABSL_CONST_INIT static absl::once_flag warn_if_not_initialized;
    absl::call_once(warn_if_not_initialized, []() {
      if (absl::log_internal::IsInitialized()) return;
      const char w[] =
          "WARNING: All log messages before absl::InitializeLog() is called"
          " are written to STDERR\n";
      absl::log_internal::WriteToStderr(w, absl::LogSeverity::kWarning);
    });

    if (!entry.stacktrace().empty()) {
      absl::log_internal::WriteToStderr(entry.stacktrace(),
                                        entry.log_severity());
    } else {
      // TODO(b/226937039): do this outside else condition once we avoid
      // ReprintFatalMessage
      absl::log_internal::WriteToStderr(
          entry.text_message_with_prefix_and_newline(), entry.log_severity());
    }
  }